

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void CLI::detail::checkParentSegments
               (vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *output,
               string *currentSection,char parentSeparator)

{
  pointer pCVar1;
  bool bVar2;
  __type _Var3;
  ulong uVar4;
  size_t ii_1;
  long lVar5;
  ulong uVar6;
  size_t ii;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parents;
  string estring;
  
  estring._M_dataplus._M_p = (pointer)&estring.field_2;
  estring._M_string_length = 0;
  estring.field_2._M_local_buf[0] = '\0';
  generate_parents(&parents,currentSection,&estring,parentSeparator);
  pCVar1 = (output->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (((output->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
       super__Vector_impl_data._M_start == pCVar1) ||
     (bVar2 = ::std::operator==(&pCVar1[-1].name,"--"), !bVar2)) {
    if (0x20 < (ulong)((long)parents.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)parents.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      lVar5 = 0x20;
      for (uVar6 = 0;
          uVar6 < ((long)parents.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)parents.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U; uVar6 = uVar6 + 1) {
        std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>(output);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   ((output->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                    _M_impl.super__Vector_impl_data._M_finish + -1),
                   parents.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (long)&((parents.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  (&(output->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                    _M_impl.super__Vector_impl_data._M_finish[-1].name,"++");
        lVar5 = lVar5 + 0x20;
      }
    }
  }
  else {
    uVar4 = (long)parents.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)parents.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    uVar6 = 2;
    if (2 < uVar4) {
      uVar6 = uVar4;
    }
    while( true ) {
      pCVar1 = (output->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      uVar4 = (long)pCVar1[-1].parents.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)pCVar1[-1].parents.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      if (uVar4 < uVar6) break;
      std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::push_back(output,pCVar1 + -1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(&(output->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                  _M_impl.super__Vector_impl_data._M_finish[-1].parents);
    }
    uVar6 = (long)parents.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)parents.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (1 < uVar6) {
      uVar6 = uVar6 - 1;
      if (uVar4 <= uVar6) {
        uVar6 = uVar4;
      }
      lVar5 = 0;
      uVar4 = 0;
LAB_0017be64:
      if (uVar6 != uVar4) {
        _Var3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&(((output->
                                               super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>
                                               )._M_impl.super__Vector_impl_data._M_finish[-1].
                                               parents.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar5),
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&((parents.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar5));
        if (_Var3) goto code_r0x0017be84;
        bVar2 = uVar6 != uVar4;
        uVar6 = uVar4;
        if (bVar2) {
          while (pCVar1 = (output->
                          super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                          _M_impl.super__Vector_impl_data._M_finish,
                uVar4 + 1 <
                (ulong)((long)pCVar1[-1].parents.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)pCVar1[-1].parents.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5)) {
            std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::push_back
                      (output,pCVar1 + -1);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::pop_back(&(output->
                        super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                        _M_impl.super__Vector_impl_data._M_finish[-1].parents);
          }
          goto LAB_0017bea3;
        }
      }
      std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::pop_back(output);
      uVar4 = uVar6;
LAB_0017bea3:
      lVar5 = uVar4 << 5;
      for (; uVar4 < ((long)parents.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)parents.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U; uVar4 = uVar4 + 1)
      {
        std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>(output);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   ((output->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                    _M_impl.super__Vector_impl_data._M_finish + -1),
                   parents.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (long)&parents.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p + lVar5);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  (&(output->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                    _M_impl.super__Vector_impl_data._M_finish[-1].name,"++");
        lVar5 = lVar5 + 0x20;
      }
    }
  }
  std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>(output);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&(output->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                    _M_impl.super__Vector_impl_data._M_finish[-1].parents,&parents);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&(output->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
              _M_impl.super__Vector_impl_data._M_finish[-1].name,"++");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&parents);
  ::std::__cxx11::string::~string((string *)&estring);
  return;
code_r0x0017be84:
  uVar4 = uVar4 + 1;
  lVar5 = lVar5 + 0x20;
  goto LAB_0017be64;
}

Assistant:

CLI11_INLINE void
checkParentSegments(std::vector<ConfigItem> &output, const std::string &currentSection, char parentSeparator) {

    std::string estring;
    auto parents = detail::generate_parents(currentSection, estring, parentSeparator);
    if(!output.empty() && output.back().name == "--") {
        std::size_t msize = (parents.size() > 1U) ? parents.size() : 2;
        while(output.back().parents.size() >= msize) {
            output.push_back(output.back());
            output.back().parents.pop_back();
        }

        if(parents.size() > 1) {
            std::size_t common = 0;
            std::size_t mpair = (std::min)(output.back().parents.size(), parents.size() - 1);
            for(std::size_t ii = 0; ii < mpair; ++ii) {
                if(output.back().parents[ii] != parents[ii]) {
                    break;
                }
                ++common;
            }
            if(common == mpair) {
                output.pop_back();
            } else {
                while(output.back().parents.size() > common + 1) {
                    output.push_back(output.back());
                    output.back().parents.pop_back();
                }
            }
            for(std::size_t ii = common; ii < parents.size() - 1; ++ii) {
                output.emplace_back();
                output.back().parents.assign(parents.begin(), parents.begin() + static_cast<std::ptrdiff_t>(ii) + 1);
                output.back().name = "++";
            }
        }
    } else if(parents.size() > 1) {
        for(std::size_t ii = 0; ii < parents.size() - 1; ++ii) {
            output.emplace_back();
            output.back().parents.assign(parents.begin(), parents.begin() + static_cast<std::ptrdiff_t>(ii) + 1);
            output.back().name = "++";
        }
    }

    // insert a section end which is just an empty items_buffer
    output.emplace_back();
    output.back().parents = std::move(parents);
    output.back().name = "++";
}